

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr-writer.h
# Opt level: O3

void __thiscall
mp::ExprWriter<mp::internal::ExprTypes,_mp::BasicProblem<mp::BasicProblemParams<int>_>::VarNamer>::
VisitCommonExpr(ExprWriter<mp::internal::ExprTypes,_mp::BasicProblem<mp::BasicProblemParams<int>_>::VarNamer>
                *this,CommonExpr e)

{
  Writer *pWVar1;
  pointer __src;
  size_t __n;
  Buffer<char> *pBVar2;
  string *psVar3;
  ptrdiff_t _Num;
  ulong uVar4;
  char *str;
  
  pWVar1 = this->writer_;
  psVar3 = BasicProblem<mp::BasicProblemParams<int>>::VarNamer::dvname_abi_cxx11_
                     ((VarNamer *)&this->vnam_,
                      *(int *)((long)e.super_BasicExpr<(mp::expr::Kind)2,_(mp::expr::Kind)3>.
                                     super_ExprBase.impl_ + 4));
  __src = (psVar3->_M_dataplus)._M_p;
  __n = psVar3->_M_string_length;
  pBVar2 = pWVar1->buffer_;
  uVar4 = pBVar2->size_ + __n;
  if (pBVar2->capacity_ < uVar4) {
    (**pBVar2->_vptr_Buffer)(pBVar2,uVar4);
  }
  if (__n != 0) {
    memmove(pBVar2->ptr_ + pBVar2->size_,__src,__n);
  }
  pBVar2->size_ = uVar4;
  return;
}

Assistant:

void VisitCommonExpr(CommonExpr e)
  { writer_ << vnam_.dvname(e.index()); }